

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_keyword_message_part(string *str)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong in_RDI;
  int i;
  bool local_a1;
  string *str_00;
  string *in_stack_ffffffffffffff78;
  string local_68 [32];
  string *in_stack_ffffffffffffffb8;
  string local_38 [36];
  int local_14;
  ulong local_10;
  bool local_1;
  
  local_14 = 0;
  local_10 = in_RDI;
  do {
    iVar1 = local_14;
    iVar3 = std::__cxx11::string::size();
    if (iVar3 <= iVar1) {
      local_1 = false;
LAB_001b1f33:
      return (bool)(local_1 & 1);
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
    if ((*pcVar4 == ':') ||
       (pcVar4 = (char *)std::__cxx11::string::operator[](local_10), *pcVar4 == '?')) {
      str_00 = local_38;
      std::__cxx11::string::substr((ulong)str_00,local_10);
      bVar2 = is_keyword_message_token(in_stack_ffffffffffffffb8);
      local_a1 = false;
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&stack0xffffffffffffff78,local_10);
        str_utils::ltrim(in_stack_ffffffffffffff78);
        local_a1 = is_keyword_message_argument(str_00);
      }
      local_1 = local_a1;
      if (bVar2) {
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      }
      std::__cxx11::string::~string((string *)local_38);
      goto LAB_001b1f33;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool Grammar::is_keyword_message_part(const std::string& str) {
    for (int i = 0; i < int(str.size()); i++)
        if (str[i] == ':' || str[i] == '?')
            return is_keyword_message_token(str.substr(0, i + 1)) &&
                   is_keyword_message_argument(str_utils::ltrim(str.substr(i + 1)));
    return false;
}